

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::randomizeConstraints(btSoftBody *this)

{
  int iVar1;
  long in_RDI;
  Link *in_stack_00000008;
  Link *in_stack_00000010;
  int ni;
  int i;
  unsigned_long seed;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x3b7f7;
  local_14 = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Link>::size
                    ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
  for (; local_14 < iVar1; local_14 = local_14 + 1) {
    btAlignedObjectArray<btSoftBody::Link>::operator[]
              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_14);
    local_10 = local_10 * 0x19660d + 0x3c6ef35f & 0xffffffff;
    btAlignedObjectArray<btSoftBody::Link>::operator[]
              ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),
               (int)(local_10 % (ulong)(long)iVar1));
    btSwap<btSoftBody::Link>(in_stack_00000010,in_stack_00000008);
  }
  local_14 = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Face>::size
                    ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
  for (; local_14 < iVar1; local_14 = local_14 + 1) {
    btAlignedObjectArray<btSoftBody::Face>::operator[]
              ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14);
    local_10 = local_10 * 0x19660d + 0x3c6ef35f & 0xffffffff;
    btAlignedObjectArray<btSoftBody::Face>::operator[]
              ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),
               (int)(local_10 % (ulong)(long)iVar1));
    btSwap<btSoftBody::Face>((Face *)in_stack_00000010,(Face *)in_stack_00000008);
  }
  return;
}

Assistant:

void			btSoftBody::randomizeConstraints()
{
	unsigned long	seed=243703;
#define NEXTRAND (seed=(1664525L*seed+1013904223L)&0xffffffff)
	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		btSwap(m_links[i],m_links[NEXTRAND%ni]);
	}
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		btSwap(m_faces[i],m_faces[NEXTRAND%ni]);
	}
#undef NEXTRAND
}